

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.h
# Opt level: O2

void __thiscall
BayesianGameIdenticalPayoff::SetUtility
          (BayesianGameIdenticalPayoff *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypeIndices,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indActionIndices,double u)

{
  RewardModelDiscreteInterface *pRVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  Index IVar2;
  uint uVar3;
  
  pRVar1 = this->_m_utilFunction;
  IVar2 = BayesianGameBase::IndividualToJointTypeIndices((BayesianGameBase *)this,indTypeIndices);
  uVar3 = (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[7])(this,indActionIndices);
  UNRECOVERED_JUMPTABLE = (pRVar1->super_QTableInterface)._vptr_QTableInterface[1];
  (*UNRECOVERED_JUMPTABLE)(u,pRVar1,(ulong)IVar2,(ulong)uVar3,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void SetUtility(const std::vector<Index>& indTypeIndices, 
                const std::vector<Index>& indActionIndices,const double u )
        {
#if DEBUG_CHECKNANINF
            if(!std::isfinite(u))
                throw(E("BayesianGameIdenticalPayoff trying to set nan or inf utility"));
#endif
            _m_utilFunction->Set(
                IndividualToJointTypeIndices(indTypeIndices),
                IndividualToJointActionIndices(indActionIndices),
                u);
        }